

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall
xLearn::AUCMetricTest_auc_test_Test::~AUCMetricTest_auc_test_Test(AUCMetricTest_auc_test_Test *this)

{
  void *in_RDI;
  
  ~AUCMetricTest_auc_test_Test((AUCMetricTest_auc_test_Test *)0x186388);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(AUCMetricTest, auc_test) {
  std::vector<real_t> Y = {-1.0, -1.0, 1.0, 1.0};
  std::vector<real_t> pred = {0.1, 0.4, 0.35, 0.8};
  AUCMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  metric.Reset();
  Y = {-1.0, -1.0, 1.0, 1.0};
  pred = {0.1, 0.4, 0.35, 0.8};
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  EXPECT_EQ(metric.metric_type(), "AUC");
}